

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

void __thiscall slang::ast::Scope::reportNameConflict(Scope *this,Symbol *member,Symbol *existing)

{
  SourceLocation noteLocation;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  bool bVar1;
  long in_RDX;
  long in_RSI;
  Scope *unaff_retaddr;
  SourceLocation in_stack_00000008;
  undefined4 in_stack_00000010;
  DiagCode in_stack_00000014;
  Type *in_stack_00000018;
  Type *existingType;
  Type *memberType;
  Diagnostic *diag;
  undefined4 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  DiagCode noteCode;
  Diagnostic *in_stack_ffffffffffffffa0;
  Diagnostic *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uVar2;
  Diagnostic *in_stack_ffffffffffffffb0;
  
  noteCode = SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0);
  bVar1 = Symbol::isValue((Symbol *)0x9f2168);
  if ((bVar1) && (bVar1 = Symbol::isValue((Symbol *)0x9f217e), bVar1)) {
    Symbol::as<slang::ast::ValueSymbol>((Symbol *)0x9f2194);
    ValueSymbol::getType((ValueSymbol *)0x9f219c);
    Symbol::as<slang::ast::ValueSymbol>((Symbol *)0x9f21b1);
    ValueSymbol::getType((ValueSymbol *)0x9f21b9);
    bVar1 = Type::isError((Type *)0x9f21cb);
    if ((bVar1) ||
       ((bVar1 = Type::isError((Type *)0x9f21d9), bVar1 ||
        (bVar1 = Type::isMatching(in_stack_00000018,
                                  (Type *)CONCAT44(in_stack_00000014,in_stack_00000010)), bVar1))))
    {
      addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
      arg._M_len._4_4_ = in_stack_ffffffffffffffac;
      arg._M_len._0_4_ = in_stack_ffffffffffffffa8;
      arg._M_str = *(char **)(in_RSI + 8);
      Diagnostic::operator<<(in_stack_ffffffffffffffa0,arg);
    }
    else {
      uVar2 = 0x2b000a;
      this_00 = *(Diagnostic **)(in_RSI + 0x18);
      addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
      arg_00._M_len._4_4_ = uVar2;
      arg_00._M_len._0_4_ = in_stack_ffffffffffffffa8;
      arg_00._M_str = (char *)in_stack_ffffffffffffffb0;
      Diagnostic::operator<<(this_00,arg_00);
      ast::operator<<(in_stack_ffffffffffffffb0,(Type *)CONCAT44(uVar2,in_stack_ffffffffffffffa8));
      ast::operator<<(in_stack_ffffffffffffffb0,(Type *)CONCAT44(uVar2,in_stack_ffffffffffffffa8));
    }
  }
  else {
    addDiag(unaff_retaddr,in_stack_00000014,in_stack_00000008);
    noteCode = SUB84((ulong)*(undefined8 *)(in_RSI + 8) >> 0x20,0);
    arg_01._M_len._4_4_ = in_stack_ffffffffffffffac;
    arg_01._M_len._0_4_ = in_stack_ffffffffffffffa8;
    arg_01._M_str = (char *)in_stack_ffffffffffffffb0;
    Diagnostic::operator<<(in_stack_ffffffffffffffa0,arg_01);
  }
  noteLocation._4_4_ = 0xa0001;
  noteLocation._0_4_ = in_stack_ffffffffffffff68;
  Diagnostic::addNote(*(Diagnostic **)(in_RDX + 0x18),noteCode,noteLocation);
  return;
}

Assistant:

void Scope::reportNameConflict(const Symbol& member, const Symbol& existing) const {
    Diagnostic* diag;
    if (existing.isValue() && member.isValue()) {
        const Type& memberType = member.as<ValueSymbol>().getType();
        const Type& existingType = existing.as<ValueSymbol>().getType();

        if (memberType.isError() || existingType.isError() || memberType.isMatching(existingType)) {
            diag = &addDiag(diag::Redefinition, member.location);
            (*diag) << member.name;
        }
        else {
            diag = &addDiag(diag::RedefinitionDifferentType, member.location);
            (*diag) << member.name << memberType << existingType;
        }
    }
    else {
        diag = &addDiag(diag::Redefinition, member.location);
        (*diag) << member.name;
    }
    diag->addNote(diag::NotePreviousDefinition, existing.location);
}